

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
__thiscall
duckdb::ColumnData::Checkpoint
          (ColumnData *this,RowGroup *row_group,ColumnCheckpointInfo *checkpoint_info)

{
  pointer __p;
  pointer pCVar1;
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *pvVar2;
  ColumnCheckpointInfo *in_RCX;
  initializer_list<std::reference_wrapper<duckdb::ColumnCheckpointState>_> __l;
  allocator_type local_139;
  vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> states;
  LogicalType local_120;
  ColumnDataCheckpointer checkpointer;
  
  (**(code **)((row_group->super_SegmentBase<duckdb::RowGroup>).start + 0xd8))();
  LogicalType::LogicalType(&local_120,(LogicalType *)&row_group->owned_version_info);
  BaseStatistics::CreateEmpty((BaseStatistics *)&checkpointer,&local_120);
  BaseStatistics::ToUnique((BaseStatistics *)&states);
  pCVar1 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
           ::operator->((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                         *)this);
  __p = states.
        super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  states.
  super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
        &pCVar1->global_stats,(pointer)__p);
  ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
              &states);
  BaseStatistics::~BaseStatistics((BaseStatistics *)&checkpointer);
  LogicalType::~LogicalType(&local_120);
  pvVar2 = SegmentTree<duckdb::ColumnSegment,_false>::ReferenceSegments
                     ((SegmentTree<duckdb::ColumnSegment,_false> *)
                      &(row_group->columns).
                       super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                       .
                       super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  if ((pvVar2->
      super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ).
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ).
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    checkpointer.checkpoint_states =
         (vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> *)
         unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
         ::operator*((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                      *)this);
    __l._M_len = 1;
    __l._M_array = (iterator)&checkpointer;
    ::std::
    vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
    ::vector(&states.
              super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
             ,__l,&local_139);
    ColumnDataCheckpointer::ColumnDataCheckpointer
              (&checkpointer,&states,
               (DatabaseInstance *)
               ((row_group->collection)._M_data)->block_manager[1].blocks._M_h._M_element_count,
               (RowGroup *)checkpoint_info,in_RCX);
    ColumnDataCheckpointer::Checkpoint(&checkpointer);
    ColumnDataCheckpointer::FinalizeCheckpoint(&checkpointer);
    ColumnDataCheckpointer::~ColumnDataCheckpointer(&checkpointer);
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                     *)&states);
  }
  return (unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
          )(unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
            )this;
}

Assistant:

unique_ptr<ColumnCheckpointState> ColumnData::Checkpoint(RowGroup &row_group, ColumnCheckpointInfo &checkpoint_info) {
	// scan the segments of the column data
	// set up the checkpoint state
	auto checkpoint_state = CreateCheckpointState(row_group, checkpoint_info.info.manager);
	checkpoint_state->global_stats = BaseStatistics::CreateEmpty(type).ToUnique();

	auto &nodes = data.ReferenceSegments();
	if (nodes.empty()) {
		// empty table: flush the empty list
		return checkpoint_state;
	}

	vector<reference<ColumnCheckpointState>> states {*checkpoint_state};
	ColumnDataCheckpointer checkpointer(states, GetDatabase(), row_group, checkpoint_info);
	checkpointer.Checkpoint();
	checkpointer.FinalizeCheckpoint();
	return checkpoint_state;
}